

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Columns(int columns_count,char *id,bool border)

{
  int *piVar1;
  undefined8 *puVar2;
  float fVar3;
  ImGuiID IVar4;
  ImGuiWindow *this;
  ImGuiColumnData *pIVar5;
  ImGuiStorage *this_00;
  undefined8 uVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImU32 col;
  ImGuiColumnData *pIVar9;
  undefined7 in_register_00000011;
  ImGuiID IVar10;
  uint uVar11;
  ImDrawList *this_01;
  int iVar12;
  char *str;
  ImGuiContext *g;
  ulong uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  bool held;
  bool hovered;
  ImGuiContext *g_1;
  ImGuiID column_id;
  ImRect column_rect;
  bool local_92;
  bool local_91;
  ImGuiContext *local_90;
  float local_88;
  ImGuiWindow *local_70;
  float local_64;
  undefined4 local_60;
  ImGuiID local_5c;
  ImVec4 local_58;
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar7 = GImGui;
  this = GImGui->CurrentWindow;
  this->Accessed = true;
  if (columns_count < 1) {
    __assert_fail("columns_count >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x2495,"void ImGui::Columns(int, const char *, bool)");
  }
  local_60 = (undefined4)CONCAT71(in_register_00000011,border);
  if ((this->DC).ColumnsCount != 1) {
    if ((this->DC).ColumnsCurrent != 0) {
      local_58.x = 0.0;
      local_58.y = 0.0;
      ItemSize((ImVec2 *)&local_58,0.0);
    }
    PopItemWidth();
    PopClipRect();
    ImDrawList::ChannelsMerge(this->DrawList);
    fVar15 = (this->DC).CursorPos.y;
    fVar16 = (this->DC).ColumnsCellMaxY;
    uVar14 = -(uint)(fVar15 <= fVar16);
    fVar15 = (float)(~uVar14 & (uint)fVar15 | (uint)fVar16 & uVar14);
    (this->DC).ColumnsCellMaxY = fVar15;
    (this->DC).CursorPos.y = fVar15;
  }
  iVar12 = (this->DC).ColumnsCount;
  if ((((iVar12 != 1 && iVar12 != columns_count) && ((this->DC).ColumnsShowBorders == true)) &&
      (this->SkipItems == false)) && (1 < (this->DC).ColumnsCount)) {
    local_64 = (this->DC).ColumnsStartPosY;
    local_90 = (ImGuiContext *)CONCAT44(local_90._4_4_,(this->DC).CursorPos.y);
    local_70 = (ImGuiWindow *)CONCAT44(local_70._4_4_,local_64);
    local_64 = local_64 + 1.0;
    iVar12 = 1;
    do {
      local_88 = (this->Pos).x;
      fVar15 = GetColumnOffset(iVar12);
      local_88 = fVar15 + local_88;
      IVar10 = (this->DC).ColumnsSetId + iVar12;
      local_40.Min.x = local_88 + -4.0;
      local_40.Max.x = local_88 + 4.0;
      local_40.Min.y = local_70._0_4_;
      local_40.Max.y = local_90._0_4_;
      local_5c = IVar10;
      bVar8 = IsClippedEx(&local_40,&local_5c,false);
      if (!bVar8) {
        ButtonBehavior(&local_40,IVar10,&local_91,&local_92,0);
        if ((local_91 != false) || (local_92 == true)) {
          pIVar7->MouseCursor = 4;
        }
        uVar14 = local_91 | 0x1c;
        if (local_92 != false) {
          uVar14 = 0x1e;
        }
        puVar2 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar14 << 4));
        local_58._0_8_ = *puVar2;
        uVar6 = puVar2[1];
        local_58.w = (float)((ulong)uVar6 >> 0x20);
        local_58.z = (float)uVar6;
        local_58.w = (GImGui->Style).Alpha * local_58.w;
        col = ColorConvertFloat4ToU32(&local_58);
        local_48.x = (float)(int)local_88;
        local_58.y = local_64;
        local_58.x = local_48.x;
        local_48.y = local_90._0_4_;
        ImDrawList::AddLine(this->DrawList,(ImVec2 *)&local_58,&local_48,col,1.0);
        if (local_92 == true) {
          if (pIVar7->ActiveIdIsJustActivated == true) {
            (pIVar7->ActiveIdClickOffset).x = (pIVar7->ActiveIdClickOffset).x + -4.0;
          }
          fVar15 = GetDraggedColumnOffset(iVar12);
          SetColumnOffset(iVar12,fVar15);
        }
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < (this->DC).ColumnsCount);
  }
  iVar12 = columns_count + 0x11223347;
  if (id != (char *)0x0) {
    iVar12 = 0x11223347;
  }
  str = "columns";
  if (id != (char *)0x0) {
    str = id;
  }
  PushID(iVar12);
  IVar10 = ImGuiWindow::GetID(this,str,(char *)0x0);
  (this->DC).ColumnsSetId = IVar10;
  PopID();
  (this->DC).ColumnsCurrent = 0;
  (this->DC).ColumnsCount = columns_count;
  (this->DC).ColumnsShowBorders = SUB41(local_60,0);
  fVar15 = (this->SizeContentsExplicit).x;
  fVar16 = 0.0;
  if ((fVar15 == 0.0) && (!NAN(fVar15))) {
    fVar15 = (this->Size).x;
  }
  fVar3 = (this->DC).IndentX;
  (this->DC).ColumnsMinX = fVar3;
  if ((this->Flags & 8) == 0) {
    fVar16 = (pIVar7->Style).ScrollbarSize;
  }
  (this->DC).ColumnsMaxX = (fVar15 - (this->Scroll).x) - fVar16;
  fVar15 = (this->DC).CursorPos.y;
  (this->DC).ColumnsStartPosY = fVar15;
  (this->DC).ColumnsCellMaxY = fVar15;
  (this->DC).ColumnsCellMinY = fVar15;
  (this->DC).ColumnsOffsetX = 0.0;
  (this->DC).CursorPos.x = (float)(int)(fVar3 + (this->Pos).x + 0.0);
  pIVar7 = GImGui;
  if (columns_count == 1) {
    iVar12 = (this->DC).ColumnsData.Capacity;
    if (iVar12 < 0) {
      uVar14 = iVar12 / 2 + iVar12;
      uVar13 = 0;
      if (0 < (int)uVar14) {
        uVar13 = (ulong)uVar14;
      }
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      pIVar9 = (ImGuiColumnData *)(*(pIVar7->IO).MemAllocFn)(uVar13 * 4);
      pIVar5 = (this->DC).ColumnsData.Data;
      if (pIVar5 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar9,pIVar5,(long)(this->DC).ColumnsData.Size << 2);
      }
      pIVar5 = (this->DC).ColumnsData.Data;
      if (pIVar5 != (ImGuiColumnData *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pIVar5);
      (this->DC).ColumnsData.Data = pIVar9;
      (this->DC).ColumnsData.Capacity = (int)uVar13;
    }
    (this->DC).ColumnsData.Size = 0;
  }
  else {
    uVar14 = columns_count + 1;
    iVar12 = (this->DC).ColumnsData.Capacity;
    if (iVar12 <= columns_count) {
      if (iVar12 == 0) {
        uVar11 = 8;
      }
      else {
        uVar11 = iVar12 / 2 + iVar12;
      }
      if ((int)uVar11 <= (int)uVar14) {
        uVar11 = uVar14;
      }
      if (iVar12 < (int)uVar11) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pIVar9 = (ImGuiColumnData *)(*(pIVar7->IO).MemAllocFn)((ulong)uVar11 << 2);
        pIVar5 = (this->DC).ColumnsData.Data;
        if (pIVar5 != (ImGuiColumnData *)0x0) {
          memcpy(pIVar9,pIVar5,(long)(this->DC).ColumnsData.Size << 2);
        }
        pIVar5 = (this->DC).ColumnsData.Data;
        if (pIVar5 != (ImGuiColumnData *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar5);
        (this->DC).ColumnsData.Data = pIVar9;
        (this->DC).ColumnsData.Capacity = uVar11;
      }
    }
    (this->DC).ColumnsData.Size = uVar14;
    IVar10 = (this->DC).ColumnsSetId;
    local_90 = GImGui;
    IVar4 = GImGui->ActiveId;
    local_88 = (float)(this->DC).ColumnsCount;
    this_00 = (this->DC).StateStorage;
    pIVar5 = (this->DC).ColumnsData.Data;
    uVar13 = 0;
    local_70 = this;
    do {
      iVar12 = (int)uVar13;
      if (IVar4 - IVar10 == iVar12) {
        local_90->ActiveIdIsAlive = true;
      }
      if (uVar14 == uVar13) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                      ,0x353,
                      "value_type &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]"
                     );
      }
      fVar15 = ImGuiStorage::GetFloat(this_00,IVar10 + iVar12,(float)iVar12 / local_88);
      pIVar5[uVar13].OffsetNorm = fVar15;
      uVar13 = uVar13 + 1;
    } while (uVar14 != uVar13);
    this_01 = local_70->DrawList;
    ImDrawList::ChannelsSplit(this_01,(local_70->DC).ColumnsCount);
    PushColumnClipRect((int)this_01);
    iVar12 = (GImGui->CurrentWindow->DC).ColumnsCurrent;
    local_88 = GetColumnOffset(iVar12 + 1);
    fVar15 = GetColumnOffset(iVar12);
    PushItemWidth((local_88 - fVar15) * 0.65);
  }
  return;
}

Assistant:

void ImGui::Columns(int columns_count, const char* id, bool border)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(columns_count >= 1);

    if (window->DC.ColumnsCount != 1)
    {
        if (window->DC.ColumnsCurrent != 0)
            ItemSize(ImVec2(0,0));   // Advance to column 0
        PopItemWidth();
        PopClipRect();
        window->DrawList->ChannelsMerge();

        window->DC.ColumnsCellMaxY = ImMax(window->DC.ColumnsCellMaxY, window->DC.CursorPos.y);
        window->DC.CursorPos.y = window->DC.ColumnsCellMaxY;
    }

    // Draw columns borders and handle resize at the time of "closing" a columns set
    if (window->DC.ColumnsCount != columns_count && window->DC.ColumnsCount != 1 && window->DC.ColumnsShowBorders && !window->SkipItems)
    {
        const float y1 = window->DC.ColumnsStartPosY;
        const float y2 = window->DC.CursorPos.y;
        for (int i = 1; i < window->DC.ColumnsCount; i++)
        {
            float x = window->Pos.x + GetColumnOffset(i);
            const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(i);
            const ImRect column_rect(ImVec2(x-4,y1),ImVec2(x+4,y2));
            if (IsClippedEx(column_rect, &column_id, false))
                continue;

            bool hovered, held;
            ButtonBehavior(column_rect, column_id, &hovered, &held);
            if (hovered || held)
                g.MouseCursor = ImGuiMouseCursor_ResizeEW;

            // Draw before resize so our items positioning are in sync with the line being drawn
            const ImU32 col = GetColorU32(held ? ImGuiCol_ColumnActive : hovered ? ImGuiCol_ColumnHovered : ImGuiCol_Column);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, y1+1.0f), ImVec2(xi, y2), col);

            if (held)
            {
                if (g.ActiveIdIsJustActivated)
                    g.ActiveIdClickOffset.x -= 4;   // Store from center of column line (we used a 8 wide rect for columns clicking)
                x = GetDraggedColumnOffset(i);
                SetColumnOffset(i, x);
            }
        }
    }

    // Differentiate column ID with an arbitrary prefix for cases where users name their columns set the same as another widget.
    // In addition, when an identifier isn't explicitly provided we include the number of columns in the hash to make it uniquer.
    PushID(0x11223347 + (id ? 0 : columns_count));
    window->DC.ColumnsSetId = window->GetID(id ? id : "columns");
    PopID();

    // Set state for first column
    window->DC.ColumnsCurrent = 0;
    window->DC.ColumnsCount = columns_count;
    window->DC.ColumnsShowBorders = border;

    const float content_region_width = (window->SizeContentsExplicit.x != 0.0f) ? window->SizeContentsExplicit.x : window->Size.x;
    window->DC.ColumnsMinX = window->DC.IndentX; // Lock our horizontal range
    window->DC.ColumnsMaxX = content_region_width - window->Scroll.x - ((window->Flags & ImGuiWindowFlags_NoScrollbar) ? 0 : g.Style.ScrollbarSize);// - window->WindowPadding().x;
    window->DC.ColumnsStartPosY = window->DC.CursorPos.y;
    window->DC.ColumnsCellMinY = window->DC.ColumnsCellMaxY = window->DC.CursorPos.y;
    window->DC.ColumnsOffsetX = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.IndentX + window->DC.ColumnsOffsetX);

    if (window->DC.ColumnsCount != 1)
    {
        // Cache column offsets
        window->DC.ColumnsData.resize(columns_count + 1);
        for (int column_index = 0; column_index < columns_count + 1; column_index++)
        {
            const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(column_index);
            KeepAliveID(column_id);
            const float default_t = column_index / (float)window->DC.ColumnsCount;
            const float t = window->DC.StateStorage->GetFloat(column_id, default_t);      // Cheaply store our floating point value inside the integer (could store a union into the map?)
            window->DC.ColumnsData[column_index].OffsetNorm = t;
        }
        window->DrawList->ChannelsSplit(window->DC.ColumnsCount);
        PushColumnClipRect();
        PushItemWidth(GetColumnWidth() * 0.65f);
    }
    else
    {
        window->DC.ColumnsData.resize(0);
    }
}